

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.hpp
# Opt level: O0

Input * __thiscall helics::Input::operator=(Input *this,Input *param_2)

{
  Interface *in_RSI;
  Input *in_RDI;
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *in_stack_00000088;
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  *in_stack_00000090;
  
  Interface::operator=(in_RSI,&in_RDI->super_Interface);
  memcpy(&in_RDI->fed,in_RSI + 1,0x38);
  std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
               *)in_RSI,
              (variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
               *)in_RDI);
  std::shared_ptr<units::precise_unit>::operator=
            ((shared_ptr<units::precise_unit> *)in_RSI,(shared_ptr<units::precise_unit> *)in_RDI);
  std::shared_ptr<units::precise_unit>::operator=
            ((shared_ptr<units::precise_unit> *)in_RSI,(shared_ptr<units::precise_unit> *)in_RDI);
  std::
  vector<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>,_std::allocator<std::pair<helics::DataType,_std::shared_ptr<units::precise_unit>_>_>_>
  ::operator=(in_stack_00000090,in_stack_00000088);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
  in_RDI->delta = (double)in_RSI[4].mName._M_dataplus._M_p;
  in_RDI->threshold = (double)in_RSI[4].mName._M_string_length;
  std::
  variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
  ::operator=((variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
               *)in_RSI,
              (variant<std::function<void_(const_double_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_long_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::complex<double>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<double,_std::allocator<double>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_helics::NamedPoint_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_bool_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::function<void_(const_TimeRepresentation<count_time<9,_long>_>_&,_TimeRepresentation<count_time<9,_long>_>)>_>
               *)in_RDI);
  return in_RDI;
}

Assistant:

class HELICS_CXX_EXPORT Input: public Interface {
  protected:
    ValueFederate* fed = nullptr;  //!< reference to the value federate
  private:
    int referenceIndex{-1};  //!< an index used for callback lookup
    void* dataReference{nullptr};  //!< pointer to a piece of containing data

    DataType targetType{DataType::HELICS_UNKNOWN};  //!< the underlying type the input targets
    DataType injectionType{
        DataType::HELICS_UNKNOWN};  //!< the type of data coming from the publication
    bool changeDetectionEnabled{false};  //!< the change detection is enabled
    bool hasUpdate{false};  //!< the value has been updated
    bool disableAssign{false};  //!< disable assignment for the object
    bool useThreshold{false};  //!< flag to indicate use a threshold for binary output
    bool multiUnits{false};  //!< flag indicating there are multiple Input Units
    MultiInputHandlingMethod inputVectorOp{
        MultiInputHandlingMethod::NO_OP};  //!< the vector processing method to use
    int32_t prevInputCount{0};  //!< the previous number of inputs
    size_t customTypeHash{0U};  //!< a hash code for the custom type
    defV lastValue{invalidDouble};  //!< the last value updated
    std::shared_ptr<units::precise_unit> outputUnits;  //!< the target output units
    std::shared_ptr<units::precise_unit> inputUnits;  //!< the units of the linked publications
    std::vector<std::pair<DataType, std::shared_ptr<units::precise_unit>>>
        sourceTypes;  //!< source information for input sources
    std::string givenTarget;  //!< the first target set for the input
    double delta{-1.0};  //!< the minimum difference
    double threshold{0.0};  //!< the threshold to use for binary decisions
    // this needs to match the defV type
    std::variant<std::function<void(const double&, Time)>,
                 std::function<void(const int64_t&, Time)>,
                 std::function<void(const std::string&, Time)>,
                 std::function<void(const std::complex<double>&, Time)>,
                 std::function<void(const std::vector<double>&, Time)>,
                 std::function<void(const std::vector<std::complex<double>>&, Time)>,
                 std::function<void(const NamedPoint&, Time)>,
                 std::function<void(const bool&, Time)>,
                 std::function<void(const Time&, Time)>>
        value_callback;  //!< callback function for the federate
  public:
    /** Default constructor*/
    Input() = default;
    /** construct from a federate and handle, mainly used by the valueFederateManager*/
    Input(ValueFederate* valueFed,
          InterfaceHandle id,
          std::string_view actName,
          std::string_view unitsOut = {});

    Input(ValueFederate* valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {});

    template<class FedPtr>
    Input(FedPtr& valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {}): Input(std::addressof(*valueFed), key, defaultType, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {});

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          std::string_view defaultType = "def",
          std::string_view units = {}):
        Input(locality, std::addressof(*valueFed), key, defaultType, units)
    {
        static_assert(
            std::is_base_of<ValueFederate, std::remove_reference_t<decltype(*valueFed)>>::value,
            "first argument must be a pointer to a ValueFederate");
    }

    Input(ValueFederate* valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}): Input(valueFed, key, typeNameStringRef(defType), units)
    {
    }

    template<class FedPtr>
    Input(FedPtr& valueFed, std::string_view key, DataType defType, std::string_view units = {}):
        Input(valueFed, key, typeNameStringRef(defType), units)
    {
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          std::string_view units = {}): Input(locality, valueFed, key, "def", units)
    {
    }

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          std::string_view units = {}): Input(locality, valueFed, key, "def", units)
    {
    }

    Input(InterfaceVisibility locality,
          ValueFederate* valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}):
        Input(locality, valueFed, key, typeNameStringRef(defType), units)
    {
    }

    template<class FedPtr>
    Input(InterfaceVisibility locality,
          FedPtr& valueFed,
          std::string_view key,
          DataType defType,
          std::string_view units = {}):
        Input(locality, valueFed, key, typeNameStringRef(defType), units)
    {
    }

    /** get the time of the last update
    @return the time of the last update
    */
    Time getLastUpdate() const;

    /** register a callback for an update notification
    @details the callback is called in the just before the time request function returns
    @param callback a function with signature void(Time time) where time is the time the value was
    updated. This callback is a notification callback and doesn't return the value
    */
    void registerNotificationCallback(std::function<void(Time)> callback);

    /** get the type of the data coming from the publication*/
    const std::string& getPublicationType() const
    {
        return ((injectionType == DataType::HELICS_UNKNOWN) ||
                (injectionType == DataType::HELICS_CUSTOM)) ?
            getInjectionType() :
            typeNameStringRef(injectionType);
    }
    /** get the type of the input*/
    const std::string& getType() const { return getExtractionType(); }
    /** get the units associated with a input*/
    const std::string& getUnits() const { return getExtractionUnits(); }
    /** add a publication for the inputs information*/
    void addPublication(std::string_view target);
    /** add a target to the input*/
    void addTarget(std::string_view target) { addPublication(target); }
    /** check if the value has been updated
    @details if changeDetection is Enabled this function also loads the value into the buffer
    @param assumeUpdate if set to true will assume there was a publication and not check it first,
    if set to false[default] it will check the federate first
    @return true if the value has been updated*/
    bool checkUpdate(bool assumeUpdate = false);

    /** clear the isUpdated flag*/
    void clearUpdate();
    /** check if the value has been updated including interpretation of the change detection
     */
    bool isUpdated();
    /** check if the value has been updated,
    @details the const version can in some circumstances return true even if the value would not be
    updated the circumstances in which this is true are a minimum change has been set, checkUpdate
    has not been call(meaning it is a standalone copy, not the one stored with the federate, and the
    value has been published but would not trigger the change detection. If this is to be avoided
    use the non-const version or call checkUpdate before calling this function.
     */
    bool isUpdated() const;

    virtual void setOption(int32_t option, int32_t value = 1) override;
    virtual int32_t getOption(int32_t option) const override;
    /** register a callback for the update
    @details the callback is called in the just before the time request function returns
    @param callback a function with signature void(X val, Time time)
    val is the new value and time is the time the value was updated
    */
    template<class X>
    void setInputNotificationCallback(std::function<void(const X&, Time)> callback)
    {
        static_assert(
            helicsType<X>() != DataType::HELICS_CUSTOM,
            "callback type must be a primary helics type one of \"double, int64_t, named_point, bool, Time "
            "std::vector<double>, std::vector<std::complex<double>>, std::complex<double>\"");
        value_callback = std::move(callback);
        registerCallback();
    }

  private:
    template<class X>
    void setDefault_impl(std::integral_constant<int, 0> /*V*/, X&& val)
    {
        /** TODO(PT) still need to make_valid for bool and Time*/
        lastValue = make_valid(std::forward<X>(val));
    }

    template<class X>
    void setDefault_impl(std::integral_constant<int, 1> /*V*/, X&& val)
    {
        lastValue = make_valid(std::forward<X>(val));
    }

    template<class X>
    void setDefault_impl(std::integral_constant<int, 2> /*V*/, X&& val)
    {
        auto res = ValueConverter<remove_cv_ref<X>>::convert(std::forward<X>(val));
        lastValue = std::string(res.to_string());
        setDefaultBytes(res);
    }

    /** setup the callback for value callback into the federate*/
    void registerCallback();

  public:
    /** set the default value to use before any update has been published
     */
    template<class X>
    void setDefault(X&& val)
    {
        setDefault_impl<X>(typeCategory<X>(), std::forward<X>(val));
    }

    void setDefaultBytes(data_view val);
    /** set the minimum delta for change detection
    @param deltaV a double with the change in a value in order to register a different value
    */
    void setMinimumChange(double deltaV) noexcept
    {
        // this first check enables change detection if it was disabled via negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = true;
        }
        delta = deltaV;
        // the second checks if we should disable from negative delta
        if (delta < 0.0) {
            changeDetectionEnabled = false;
        }
    }
    /** enable change detection
    @param enabled (optional) set to false to disable change detection true(default) to enable it
    */
    void enableChangeDetection(bool enabled = true) noexcept { changeDetectionEnabled = enabled; }

  private:
    /** deal with the callback from the application API*/
    void handleCallback(Time time);
    template<class X>
    void getValue_impl(std::integral_constant<int, primaryType> /*V*/, X& out);

    /** handle special case for character return data*/
    void getValue_impl(std::integral_constant<int, primaryType> /*V*/, char& out)
    {
        out = getValueChar();
    }

    /** handle special case for character return data*/
    void getValue_impl(std::integral_constant<int, convertibleType> /*V*/, char& out)
    {
        out = getValueChar();
    }

    template<class X>
    void getValue_impl(std::integral_constant<int, convertibleType> /*V*/, X& out)
    {
        std::conditional_t<std::is_integral<X>::value,
                           std::conditional_t<std::is_same<X, char>::value, char, int64_t>,
                           double>
            gval;
        getValue_impl(std::integral_constant<int, primaryType>(), gval);
        out = static_cast<X>(gval);
    }

    template<class X>
    void getValue_impl(std::integral_constant<int, nonConvertibleType> /*V*/, X& out)
    {
        ValueConverter<X>::interpret(getBytes(), out);
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, primaryType> /*V*/)
    {
        X val;  // NOLINT
        getValue_impl(std::integral_constant<int, primaryType>(), val);
        return val;
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, convertibleType> /*V*/)
    {
        std::conditional_t<std::is_integral<X>::value,
                           std::conditional_t<std::is_same<X, char>::value, char, int64_t>,
                           double>
            gval;
        getValue_impl(std::integral_constant<int, primaryType>(), gval);
        return static_cast<X>(gval);
    }

    template<class X>
    X getValue_impl(std::integral_constant<int, nonConvertibleType> /*V*/)
    {
        return ValueConverter<X>::interpret(getBytes());
    }

  public:
    /** get double vector value functions to retrieve data by a C array of doubles*/
    int getValue(double* data, int maxsize);
    /** get a complex double vector value functions to retrieve data by a C array of doubles*/
    int getComplexValue(double* data, int maxsize);
    /** get string value functions to retrieve data by a C string*/
    int getValue(char* str, int maxsize);
    /** get the latest value for the input
    @param[out] out the location to store the value
    */
    template<class X>
    void getValue(X& out)
    {
        getValue_impl<X>(typeCategory<X>(), out);
    }
    /** get the most recent value
    @return the value*/
    template<class X>
    auto getValue()
    {
        return getValue_impl<remove_cv_ref<X>>(typeCategory<X>());
    }

    template<class X>
    const X& getValueRef();
    /** get the current value as a Double*/
    double getDouble() { return getValue_impl<double>(std::integral_constant<int, primaryType>()); }
    /** get the current value as a string*/
    const std::string& getString() { return getValueRef<std::string>(); }

    /** get the raw binary data*/
    data_view getBytes();
    /** get the size of the raw data*/
    size_t getByteCount();
    /** get the size of the data if it were a string*/
    size_t getStringSize();
    /** get the number of elements in the data if it were a vector*/
    size_t getVectorSize();

    /** get the HELICS data type for the input*/
    DataType getHelicsType() const { return targetType; }

    /** get the HELICS data type for the publication*/
    DataType getHelicsInjectionType() const { return injectionType; }

    MultiInputHandlingMethod getMultiInputMode() const { return inputVectorOp; }

    bool vectorDataProcess(const std::vector<std::shared_ptr<const SmallBuffer>>& dataV);

    const std::string& getTarget() const
    {
        return (!givenTarget.empty()) ? givenTarget : getSourceTargets();
    }

    virtual const std::string& getDisplayName() const override
    {
        return (mName.empty()) ? getTarget() : getName();
    }

  private:
    /** load some information about the data source such as type and units*/
    void loadSourceInformation();
    /** helper class for getting a character since that is a bit odd*/
    char getValueChar();
    /** check if updates from the federate are allowed*/
    bool allowDirectFederateUpdate() const
    {
        return hasUpdate && !changeDetectionEnabled &&
            inputVectorOp == MultiInputHandlingMethod::NO_OP;
    }
    data_view checkAndGetFedUpdate();
    void forceCoreDataUpdate();
    friend class ValueFederateManager;
}